

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question>::setCapacity
          (Vector<capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,size_t newSize)

{
  Question *pQVar1;
  RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *pRVar2;
  Question *pQVar3;
  ulong uVar4;
  __off_t in_RDX;
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> newBuilder;
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> local_38;
  
  uVar4 = ((long)(this->builder).pos - (long)(this->builder).ptr >> 3) * -0x3333333333333333;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question>::truncate
              (&this->builder,(char *)newSize,in_RDX);
  }
  local_38.ptr = (Question *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x28,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.ptr + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_38.pos = local_38.ptr;
  local_38.pos = kj::_::
                 CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Question,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_true,_false>
                 ::apply(local_38.ptr,(this->builder).ptr,(this->builder).pos);
  ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question>::operator=
            (&this->builder,&local_38);
  pQVar3 = local_38.endPtr;
  pRVar2 = local_38.pos;
  pQVar1 = local_38.ptr;
  if (local_38.ptr != (Question *)0x0) {
    local_38.ptr = (Question *)0x0;
    local_38.pos = (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)0x0;
    local_38.endPtr = (Question *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pQVar1,0x28,
               ((long)pRVar2 - (long)pQVar1 >> 3) * -0x3333333333333333,
               ((long)pQVar3 - (long)pQVar1 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<capnp::_::RpcSystemBase::RpcConnectionState::Question>::
               destruct);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }